

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFindBase.cxx
# Opt level: O0

bool __thiscall cmFindBase::CheckForVariableInCache(cmFindBase *this)

{
  bool bVar1;
  CacheEntryType CVar2;
  char *pcVar3;
  char *local_a8;
  allocator<char> local_61;
  string local_60;
  char *local_40;
  char *hs;
  bool cached;
  char *pcStack_30;
  bool found;
  char *cacheEntry;
  cmState *state;
  char *cacheValue;
  cmFindBase *this_local;
  
  cacheValue = (char *)this;
  state = (cmState *)
          cmMakefile::GetDefinition
                    ((this->super_cmFindCommon).super_cmCommand.Makefile,&this->VariableName);
  if (state != (cmState *)0x0) {
    cacheEntry = (char *)cmMakefile::GetState((this->super_cmFindCommon).super_cmCommand.Makefile);
    pcStack_30 = cmState::GetCacheEntryValue((cmState *)cacheEntry,&this->VariableName);
    bVar1 = cmSystemTools::IsNOTFOUND((char *)state);
    pcVar3 = cacheEntry;
    hs._7_1_ = (bVar1 ^ 0xffU) & 1;
    hs._6_1_ = pcStack_30 != (char *)0x0;
    if (hs._7_1_ != 0) {
      if (((bool)hs._6_1_) &&
         (CVar2 = cmState::GetCacheEntryType((cmState *)cacheEntry,&this->VariableName),
         CVar2 == UNINITIALIZED)) {
        this->AlreadyInCacheWithoutMetaInfo = true;
      }
      return true;
    }
    if ((bool)hs._6_1_) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_60,"HELPSTRING",&local_61)
      ;
      pcVar3 = cmState::GetCacheEntryProperty((cmState *)pcVar3,&this->VariableName,&local_60);
      std::__cxx11::string::~string((string *)&local_60);
      std::allocator<char>::~allocator(&local_61);
      local_a8 = pcVar3;
      if (pcVar3 == (char *)0x0) {
        local_a8 = "(none)";
      }
      local_40 = pcVar3;
      std::__cxx11::string::operator=((string *)&this->VariableDocumentation,local_a8);
    }
  }
  return false;
}

Assistant:

bool cmFindBase::CheckForVariableInCache()
{
  if (const char* cacheValue =
        this->Makefile->GetDefinition(this->VariableName)) {
    cmState* state = this->Makefile->GetState();
    const char* cacheEntry = state->GetCacheEntryValue(this->VariableName);
    bool found = !cmSystemTools::IsNOTFOUND(cacheValue);
    bool cached = cacheEntry != nullptr;
    if (found) {
      // If the user specifies the entry on the command line without a
      // type we should add the type and docstring but keep the
      // original value.  Tell the subclass implementations to do
      // this.
      if (cached &&
          state->GetCacheEntryType(this->VariableName) ==
            cmStateEnums::UNINITIALIZED) {
        this->AlreadyInCacheWithoutMetaInfo = true;
      }
      return true;
    }
    if (cached) {
      const char* hs =
        state->GetCacheEntryProperty(this->VariableName, "HELPSTRING");
      this->VariableDocumentation = hs ? hs : "(none)";
    }
  }
  return false;
}